

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall
TimerTest_scopedWithIterationsCancel_Test::TimerTest_scopedWithIterationsCancel_Test
          (TimerTest_scopedWithIterationsCancel_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a0848;
  return;
}

Assistant:

TEST(TimerTest, scopedWithIterationsCancel) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	timer timer_obj{ period, total_iterations, [&iterations, &promise](timer& in_timer) {
		if (++iterations == total_iterations) {
			promise.set_value();
			in_timer.cancel();
		}
	} };

	EXPECT_EQ(promise.get_future().wait_for(timeout), std::future_status::ready);
}